

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemIdentifier.cpp
# Opt level: O0

bool __thiscall DIS::SystemIdentifier::operator==(SystemIdentifier *this,SystemIdentifier *rhs)

{
  bool local_19;
  bool ivarsEqual;
  SystemIdentifier *rhs_local;
  SystemIdentifier *this_local;
  
  local_19 = this->_systemName == rhs->_systemName && this->_systemType == rhs->_systemType;
  if (this->_systemMode != rhs->_systemMode) {
    local_19 = false;
  }
  if (this->_changeOptions != rhs->_changeOptions) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool SystemIdentifier::operator ==(const SystemIdentifier& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_systemType == rhs._systemType) ) ivarsEqual = false;
     if( ! (_systemName == rhs._systemName) ) ivarsEqual = false;
     if( ! (_systemMode == rhs._systemMode) ) ivarsEqual = false;
     if( ! (_changeOptions == rhs._changeOptions) ) ivarsEqual = false;

    return ivarsEqual;
 }